

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O0

void __thiscall polyscope::SlicePlane::setTransparency(SlicePlane *this,double newVal)

{
  PersistentValue<float> *in_XMM0_Qa;
  double *in_stack_ffffffffffffffe8;
  
  PersistentValue<float>::operator=(in_XMM0_Qa,in_stack_ffffffffffffffe8);
  requestRedraw();
  return;
}

Assistant:

void SlicePlane::setTransparency(double newVal) {
  transparency = newVal;
  requestRedraw();
}